

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::WriteGltfStream(ostream *stream,string *content)

{
  ostream *poVar1;
  long in_RDX;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)content,in_RDX);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0;
}

Assistant:

static bool WriteGltfStream(std::ostream &stream, const std::string &content) {
  stream << content << std::endl;
  return stream.good();
}